

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

void __thiscall wasm::GlobalTypeRewriter::mapTypes(GlobalTypeRewriter *this,TypeMap *oldToNewTypes)

{
  bool bVar1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *this_00;
  reference this_01;
  pointer pFVar2;
  HeapType HVar3;
  reference pTVar4;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *this_02;
  reference this_03;
  pointer pTVar5;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *this_04;
  reference this_05;
  pointer pEVar6;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *this_06;
  reference this_07;
  pointer pGVar7;
  Type TVar8;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *this_08;
  reference this_09;
  pointer pTVar9;
  Signature SVar10;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *tag;
  iterator __end1_4;
  iterator __begin1_4;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *__range1_4;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range1_3;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *elementSegment;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *__range1_2;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *table;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *__range1_1;
  Type *var;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range2;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range1;
  undefined1 local_240 [8];
  PassRunner runner;
  CodeUpdater updater;
  TypeMap *oldToNewTypes_local;
  GlobalTypeRewriter *this_local;
  
  updater.oldToNewTypes = oldToNewTypes;
  mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std::
  equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::HeapType>>>const&)::
  CodeUpdater::CodeUpdater(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
  HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
  HeapType>_>_>_const__(&runner.skippedPasses._M_h._M_single_bucket,oldToNewTypes);
  PassRunner::PassRunner((PassRunner *)local_240,this->wasm);
  this_00 = &this->wasm->functions;
  __end1 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(this_00);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                *)&func);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
              ::operator*(&__end1);
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (this_01);
    HVar3 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std
            ::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
            HeapType>>>const&)::CodeUpdater::getNew(wasm::HeapType_
                      (&runner.skippedPasses._M_h._M_single_bucket,(pFVar2->type).id);
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (this_01);
    (pFVar2->type).id = HVar3.id;
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (this_01);
    __end2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(&pFVar2->vars);
    var = (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(&pFVar2->vars);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                  *)&var);
      if (!bVar1) break;
      pTVar4 = __gnu_cxx::
               __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
               ::operator*(&__end2);
      TVar8 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
              HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::
              HeapType_const,wasm::HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                        (&runner.skippedPasses._M_h._M_single_bucket,pTVar4->id);
      pTVar4->id = TVar8.id;
      __gnu_cxx::
      __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end1);
  }
  WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>::
  run((WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
       *)&runner.skippedPasses._M_h._M_single_bucket,(PassRunner *)local_240,this->wasm);
  Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::walkModuleCode
            ((Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_> *)
             ((long)&updater.
                     super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
                     .super_Pass.name.field_2 + 8),this->wasm);
  this_02 = &this->wasm->tables;
  __end1_1 = std::
             vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ::begin(this_02);
  table = (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
          std::
          vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ::end(this_02);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                        *)&table);
    if (!bVar1) break;
    this_03 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
              ::operator*(&__end1_1);
    pTVar5 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(this_03);
    TVar8 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std
            ::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
            HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                      (&runner.skippedPasses._M_h._M_single_bucket,(pTVar5->type).id);
    pTVar5 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(this_03);
    (pTVar5->type).id = TVar8.id;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
    ::operator++(&__end1_1);
  }
  this_04 = &this->wasm->elementSegments;
  __end1_2 = std::
             vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ::begin(this_04);
  elementSegment =
       (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
       std::
       vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
       ::end(this_04);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                        *)&elementSegment);
    if (!bVar1) break;
    this_05 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
              ::operator*(&__end1_2);
    pEVar6 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(this_05);
    TVar8 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std
            ::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
            HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                      (&runner.skippedPasses._M_h._M_single_bucket,(pEVar6->type).id);
    pEVar6 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(this_05);
    (pEVar6->type).id = TVar8.id;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
    ::operator++(&__end1_2);
  }
  this_06 = &this->wasm->globals;
  __end1_3 = std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::begin(this_06);
  global = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
           std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::end(this_06);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                        *)&global);
    if (!bVar1) break;
    this_07 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
              ::operator*(&__end1_3);
    pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->(this_07);
    TVar8 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std
            ::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
            HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                      (&runner.skippedPasses._M_h._M_single_bucket,(pGVar7->type).id);
    pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->(this_07);
    (pGVar7->type).id = TVar8.id;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
    ::operator++(&__end1_3);
  }
  this_08 = &this->wasm->tags;
  __end1_4 = std::
             vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             ::begin(this_08);
  tag = (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)
        std::
        vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ::end(this_08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_4,
                       (__normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
                        *)&tag);
    if (!bVar1) break;
    this_09 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
              ::operator*(&__end1_4);
    pTVar9 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(this_09);
    SVar10 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std
             ::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
             HeapType>>>const&)::CodeUpdater::getNew(wasm::Signature_
                       (&runner.skippedPasses._M_h._M_single_bucket,pTVar9->sig);
    pTVar9 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(this_09);
    pTVar9->sig = SVar10;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
    ::operator++(&__end1_4);
  }
  PassRunner::~PassRunner((PassRunner *)local_240);
  mapTypes::CodeUpdater::~CodeUpdater((CodeUpdater *)&runner.skippedPasses._M_h._M_single_bucket);
  return;
}

Assistant:

void GlobalTypeRewriter::mapTypes(const TypeMap& oldToNewTypes) {
  // Replace all the old types in the module with the new ones.
  struct CodeUpdater
    : public WalkerPass<
        PostWalker<CodeUpdater, UnifiedExpressionVisitor<CodeUpdater>>> {
    bool isFunctionParallel() override { return true; }

    const TypeMap& oldToNewTypes;

    CodeUpdater(const TypeMap& oldToNewTypes) : oldToNewTypes(oldToNewTypes) {}

    std::unique_ptr<Pass> create() override {
      return std::make_unique<CodeUpdater>(oldToNewTypes);
    }

    Type getNew(Type type) {
      if (type.isRef()) {
        return Type(getNew(type.getHeapType()), type.getNullability());
      }
      if (type.isTuple()) {
        auto tuple = type.getTuple();
        for (auto& t : tuple.types) {
          t = getNew(t);
        }
        return Type(tuple);
      }
      return type;
    }

    HeapType getNew(HeapType type) {
      if (type.isBasic()) {
        return type;
      }
      auto iter = oldToNewTypes.find(type);
      if (iter != oldToNewTypes.end()) {
        return iter->second;
      }
      return type;
    }

    Signature getNew(Signature sig) {
      return Signature(getNew(sig.params), getNew(sig.results));
    }

    void visitExpression(Expression* curr) {
      // local.get and local.tee are special in that their type is tied to the
      // type of the local in the function, which is tied to the signature. That
      // means we must update it based on the signature, and not on the old type
      // in the local.
      //
      // We have already updated function signatures by the time we get here,
      // which means we can just apply the current local type that we see (there
      // is no need to call getNew(), which we already did on the function's
      // signature itself).
      if (auto* get = curr->dynCast<LocalGet>()) {
        curr->type = getFunction()->getLocalType(get->index);
        return;
      } else if (auto* tee = curr->dynCast<LocalSet>()) {
        // Rule out a local.set and unreachable code.
        if (tee->type != Type::none && tee->type != Type::unreachable) {
          curr->type = getFunction()->getLocalType(tee->index);
        }
        return;
      }

      // Update the type to the new one.
      curr->type = getNew(curr->type);

      // Update any other type fields as well.

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_HEAPTYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
    }
  };

  CodeUpdater updater(oldToNewTypes);
  PassRunner runner(&wasm);

  // Update functions first, so that we see the updated types for locals (which
  // can change if the function signature changes).
  for (auto& func : wasm.functions) {
    func->type = updater.getNew(func->type);
    for (auto& var : func->vars) {
      var = updater.getNew(var);
    }
  }

  updater.run(&runner, &wasm);
  updater.walkModuleCode(&wasm);

  // Update global locations that refer to types.
  for (auto& table : wasm.tables) {
    table->type = updater.getNew(table->type);
  }
  for (auto& elementSegment : wasm.elementSegments) {
    elementSegment->type = updater.getNew(elementSegment->type);
  }
  for (auto& global : wasm.globals) {
    global->type = updater.getNew(global->type);
  }
  for (auto& tag : wasm.tags) {
    tag->sig = updater.getNew(tag->sig);
  }
}